

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O2

void __thiscall pg::MSPMSolver::run(MSPMSolver *this)

{
  Game *pGVar1;
  bitset *pbVar2;
  int i_1;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  _Elt_pointer piVar12;
  ostream *poVar13;
  Error *pEVar14;
  int i;
  int iVar15;
  _Elt_pointer piVar16;
  char *pcVar17;
  ulong uVar18;
  int n_1;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  bool bVar23;
  int from;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  int *local_88;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  
  pGVar1 = (this->super_Solver).game;
  uVar21 = pGVar1->n_vertices;
  local_88 = pGVar1->_priority;
  lVar19 = (long)*(int *)((long)local_88 + ((long)((uVar21 << 0x20) + -0x100000000) >> 0x1e));
  local_98 = lVar19 + 1;
  local_a0 = local_98 * uVar21;
  this->k = (int)local_98;
  piVar7 = (int *)operator_new__(-(ulong)(local_a0 >> 0x3e != 0) | local_a0 * 4);
  this->pms = piVar7;
  uVar18 = -(ulong)(uVar21 >> 0x3e != 0) | uVar21 * 4;
  local_a8 = uVar21;
  piVar8 = (int *)operator_new__(uVar18);
  this->strategy = piVar8;
  uVar21 = 0xffffffffffffffff;
  if (-2 < lVar19) {
    uVar21 = lVar19 * 4 + 4;
  }
  piVar9 = (int *)operator_new__(uVar21);
  this->counts = piVar9;
  local_90 = uVar18;
  piVar10 = (int *)operator_new__(uVar18);
  this->cover = piVar10;
  piVar11 = (int *)operator_new__(uVar21);
  this->tmp = piVar11;
  piVar11 = (int *)operator_new__(uVar21);
  uVar21 = local_a8;
  this->best = piVar11;
  for (uVar18 = 0; (~((long)local_a0 >> 0x3f) & local_a0) != uVar18; uVar18 = uVar18 + 1) {
    piVar7[uVar18] = 0;
  }
  uVar20 = ~((long)local_a8 >> 0x3f) & local_a8;
  for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
    piVar8[uVar18] = -1;
  }
  pbVar2 = (this->super_Solver).disabled;
  for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
    bVar23 = (pbVar2->_bits[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) == 0;
    piVar10[uVar18] = (bVar23 - 2) + (uint)bVar23;
  }
  for (uVar18 = 0; (~((int)(uint)local_98 >> 0x1f) & (uint)local_98) != uVar18; uVar18 = uVar18 + 1)
  {
    piVar9[uVar18] = 0;
  }
  for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
    if (piVar10[uVar18] == 0) {
      piVar9[local_88[uVar18]] = piVar9[local_88[uVar18]] + 1;
    }
  }
  this->lift_attempt = 0;
  this->lift_count = 0;
  piVar7 = (int *)operator_new__(local_90);
  this->dirty = piVar7;
  for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
    piVar7[uVar18] = 0;
  }
  this->coverdepth = 0;
  uVar21 = uVar21 & 0xffffffff;
  while( true ) {
    uVar21 = uVar21 - 1;
    uVar6 = (uint)uVar21;
    if ((int)uVar6 < 0) break;
    uVar22 = uVar6 & 0x7fffffff;
    iVar3 = this->cover[uVar22];
    if (iVar3 == 0) {
      bVar23 = lift(this,uVar6,-1);
      iVar3 = this->cover[uVar22];
    }
    else {
      bVar23 = false;
    }
    if ((bVar23 != false) || (iVar3 == -1)) {
      pGVar1 = (this->super_Solver).game;
      piVar7 = pGVar1->_inedges + pGVar1->_firstins[uVar22];
      while( true ) {
        iVar3 = *piVar7;
        if ((long)iVar3 == -1) break;
        if ((this->cover[iVar3] == 0) && (bVar23 = lift(this,iVar3,uVar6), bVar23)) {
          todo_push(this,iVar3);
        }
        piVar7 = piVar7 + 1;
      }
    }
  }
  piVar12 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur;
  piVar16 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_cur;
  do {
    if (piVar16 == piVar12) {
      if ((this->super_Solver).trace != 0) {
        for (lVar19 = 0; lVar19 < ((this->super_Solver).game)->n_vertices; lVar19 = lVar19 + 1) {
          poVar13 = std::operator<<((this->super_Solver).logger,"\x1b[1;31mnode ");
          iVar5 = (int)lVar19;
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar5);
          poVar13 = std::operator<<(poVar13,"/");
          poVar13 = (ostream *)
                    std::ostream::operator<<(poVar13,((this->super_Solver).game)->_priority[lVar19])
          ;
          iVar3 = Solver::owner(&this->super_Solver,iVar5);
          pcVar17 = " (odd)";
          if (iVar3 == 0) {
            pcVar17 = " (even)";
          }
          poVar13 = std::operator<<(poVar13,pcVar17);
          std::operator<<(poVar13,"\x1b[m is");
          pm_stream(this,(this->super_Solver).logger,this->pms + (long)iVar5 * (long)this->k);
          if (-1 < this->cover[lVar19]) {
            poVar13 = std::operator<<((this->super_Solver).logger," cover: ");
            std::ostream::operator<<(poVar13,this->cover[lVar19]);
          }
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
      }
      uVar21 = 0;
      do {
        if (((this->super_Solver).game)->n_vertices <= (long)uVar21) {
          if (this->pms != (int *)0x0) {
            operator_delete__(this->pms);
          }
          if (this->strategy != (int *)0x0) {
            operator_delete__(this->strategy);
          }
          if (this->counts != (int *)0x0) {
            operator_delete__(this->counts);
          }
          if (this->cover != (int *)0x0) {
            operator_delete__(this->cover);
          }
          if (this->dirty != (int *)0x0) {
            operator_delete__(this->dirty);
          }
          if (this->tmp != (int *)0x0) {
            operator_delete__(this->tmp);
          }
          if (this->best != (int *)0x0) {
            operator_delete__(this->best);
          }
          poVar13 = std::operator<<((this->super_Solver).logger,"solved with ");
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->lift_count);
          poVar13 = std::operator<<(poVar13," lifts, ");
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->lift_attempt);
          poVar13 = std::operator<<(poVar13," lift attempts.");
          std::endl<char,std::char_traits<char>>(poVar13);
          return;
        }
        if ((((this->super_Solver).disabled)->_bits[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0) {
          iVar5 = (int)uVar21;
          lVar19 = (long)iVar5 * (long)this->k;
          iVar3 = this->pms[lVar19];
          if ((iVar3 == -1) != (this->pms[lVar19 + 1] != -1)) {
            pEVar14 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(pEVar14,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                         ,0x204);
            __cxa_throw(pEVar14,&Error::typeinfo,Error::~Error);
          }
          uVar6 = Solver::owner(&this->super_Solver,iVar5);
          iVar4 = -1;
          uVar22 = (uint)(iVar3 != -1);
          if (uVar6 == uVar22) {
            iVar4 = this->strategy[uVar21];
          }
          Solver::solve(&this->super_Solver,iVar5,uVar22,iVar4);
        }
        uVar21 = uVar21 + 1;
      } while( true );
    }
    iVar3 = todo_pop(this);
    if (this->cover[iVar3] + 1U < 2) {
      pGVar1 = (this->super_Solver).game;
      piVar7 = pGVar1->_inedges + pGVar1->_firstins[iVar3];
      while( true ) {
        iVar5 = *piVar7;
        if ((long)iVar5 == -1) break;
        if ((this->cover[iVar5] == 0) && (bVar23 = lift(this,iVar5,iVar3), bVar23)) {
          todo_push(this,iVar5);
        }
        piVar7 = piVar7 + 1;
      }
    }
    while( true ) {
      piVar12 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      piVar16 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (piVar16 != piVar12) break;
      uVar6 = this->coverdepth;
      uVar21 = (ulong)uVar6;
      if (uVar6 == 0) break;
      this->coverdepth = uVar6 - 1;
      std::queue<int,std::deque<int,std::allocator<int>>>::
      queue<std::deque<int,std::allocator<int>>,void>(&q);
      local_a8 = uVar21;
      for (from = 0; lVar19 = (long)from, lVar19 < ((this->super_Solver).game)->n_vertices;
          from = from + 1) {
        if (this->cover[lVar19] == (int)uVar21) {
          this->cover[lVar19] = 0;
          if ((this->super_Solver).trace != 0) {
            poVar13 = std::operator<<((this->super_Solver).logger,"\x1b[7;31;1muncovering\x1b[m ");
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,from);
            std::endl<char,std::char_traits<char>>(poVar13);
          }
          iVar3 = Solver::owner(&this->super_Solver,from);
          pGVar1 = (this->super_Solver).game;
          bVar23 = false;
          piVar7 = pGVar1->_outedges + pGVar1->_firstouts[from];
          while( true ) {
            iVar5 = *piVar7;
            uVar21 = (ulong)iVar5;
            if (uVar21 == 0xffffffffffffffff) break;
            if (this->cover[uVar21] != -2) {
              pGVar1 = (this->super_Solver).game;
              if (((pGVar1->solved)._bits[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0) {
                bVar23 = true;
              }
              else {
                iVar4 = Game::getWinner(pGVar1,iVar5);
                if (iVar4 == iVar3) {
                  Solver::solve(&this->super_Solver,from,iVar3,iVar5);
                  this->cover[from] = -1;
                  this->pms[from * this->k + iVar3] = -1;
                  std::deque<int,_std::allocator<int>_>::push_back
                            ((deque<int,_std::allocator<int>_> *)&q,&from);
                  todo_push(this,from);
                  break;
                }
              }
            }
            piVar7 = piVar7 + 1;
          }
          uVar21 = local_a8;
          if (this->cover[from] != -1) {
            if (bVar23) {
              lift(this,from,-1);
            }
            else {
              Solver::solve(&this->super_Solver,from,1 - iVar3,-1);
              this->cover[from] = -1;
              this->pms[from * this->k + (1 - iVar3)] = -1;
              std::deque<int,_std::allocator<int>_>::push_back
                        ((deque<int,_std::allocator<int>_> *)&q,&from);
            }
            todo_push(this,from);
          }
        }
      }
      while (q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur !=
             q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) {
        iVar3 = *q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                 _M_start._M_cur;
        uVar21 = (ulong)iVar3;
        std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)&q);
        pGVar1 = (this->super_Solver).game;
        if (((pGVar1->solved)._bits[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0) {
          pEVar14 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(pEVar14,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                       ,0x1dc);
          __cxa_throw(pEVar14,&Error::typeinfo,Error::~Error);
        }
        iVar5 = Game::getWinner(pGVar1,iVar3);
        pGVar1 = (this->super_Solver).game;
        piVar7 = pGVar1->_inedges + pGVar1->_firstins[uVar21];
        while( true ) {
          iVar4 = *piVar7;
          if ((long)iVar4 == -1) break;
          from = iVar4;
          if (this->cover[iVar4] == 0) {
            uVar6 = Solver::owner(&this->super_Solver,iVar4);
            iVar4 = from;
            uVar22 = (uint)(iVar5 != 0);
            if (uVar6 == uVar22) {
LAB_0015e75c:
              uVar6 = Solver::owner(&this->super_Solver,from);
              iVar15 = -1;
              if (uVar6 == uVar22) {
                iVar15 = iVar3;
              }
              Solver::solve(&this->super_Solver,iVar4,uVar22,iVar15);
              this->cover[from] = -1;
              this->pms[(int)(from * this->k + uVar22)] = -1;
              std::deque<int,_std::allocator<int>_>::push_back
                        ((deque<int,_std::allocator<int>_> *)&q,&from);
              todo_push(this,from);
            }
            else {
              pGVar1 = (this->super_Solver).game;
              piVar8 = pGVar1->_outedges + pGVar1->_firstouts[from];
              do {
                iVar15 = *piVar8;
                if ((long)iVar15 == -1) goto LAB_0015e75c;
                piVar8 = piVar8 + 1;
              } while (this->cover[iVar15] < 0);
              if (this->cover[iVar15] != 0) {
                pEVar14 = (Error *)__cxa_allocate_exception(0x40);
                Error::Error(pEVar14,"logic error",
                             "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                             ,0x1e6);
                __cxa_throw(pEVar14,&Error::typeinfo,Error::~Error);
              }
            }
          }
          piVar7 = piVar7 + 1;
        }
      }
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                ((_Deque_base<int,_std::allocator<int>_> *)&q);
    }
  } while( true );
}

Assistant:

void
MSPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;

    // now create the data structure, for each node
    pms = new int[k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    cover = new int[nodecount()];
    tmp = new int[k];
    best = new int[k];

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize cover
    for (int i=0; i<nodecount(); i++) cover[i] = disabled[i] ? -2 : 0;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (cover[i] == 0) counts[priority(i)]++;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue/stack to store the dirty vertices.
     */

    // initialize all nodes as not dirty
    dirty = new int[nodecount()];
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // initialize cover depth to 0
    coverdepth = 0;

    /**
     * First loop, starting with standard "lift" for nodes and "liftR" for predecessors.
     * Can already find "Top" here, so add covered nodes to <deferred>.
     */
    for (int n=nodecount()-1; n>=0; n--) {
        bool lifted = cover[n] == 0 and lift(n, -1);
        if (cover[n] == -1 or lifted) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (cover[from] == 0 and lift(from, n)) todo_push(from);
            }
        }
    }

    /**
     * The main loop
     */

    while (!todo.empty()) {
        int n = todo_pop();
        if (cover[n] == -1 or cover[n] == 0) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (cover[from] == 0 and lift(from, n)) todo_push(from);
            }
        }

        while (todo.empty() and coverdepth != 0) {
            int m = coverdepth--;
            std::queue<int> q;

            for (int n=0; n<nodecount(); n++) {
                if (cover[n] != m) continue;
                cover[n] = 0;

                if (trace) logger << "\033[7;31;1muncovering\033[m " << n << std::endl;

                // try to see if it is attracted
                const int pl = owner(n);
                bool escapes = false;
                for (auto curedge = outs(n); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to] == -2) continue;
                    if (game.isSolved(to)) {
                        if (game.getWinner(to) == pl) {
                            Solver::solve(n, pl, to);
                            cover[n] = -1;
                            pms[k*n+pl] = -1;
                            q.push(n);
                            todo_push(n);
                            break;
                        }
                    } else {
                        escapes = true;
                    }
                }
                if (cover[n] == -1) continue;
                if (!escapes) {
                    Solver::solve(n, 1-pl, -1);
                    cover[n] = -1;
                    pms[k*n+(1-pl)] = -1;
                    q.push(n);
                    todo_push(n);
                    continue;
                }

                // not attracted, lift
                lift(n, -1);

                // TODO: always or only if lifted?
                todo_push(n);
            }

            // attract within uncovered area to <node> for <pl>
            while (!q.empty()) {
                int n = q.front();
                q.pop();
                if (!game.isSolved(n)) LOGIC_ERROR;
                const bool pl = game.getWinner(n);
                for (auto curedge = ins(n); *curedge != -1; curedge++) {
                    int from = *curedge;
                    if (cover[from]) continue;
                    if (owner(from) != pl) {
                        bool escapes = false;
                        for (auto curedge = outs(from); *curedge != -1; curedge++) {
                            int to = *curedge;
                            if (cover[to] < 0) continue;
                            if (cover[to] != 0) LOGIC_ERROR;
                            escapes = true;
                            break;
                        }
                        if (escapes) continue;
                    }
                    Solver::solve(from, pl, owner(from) == pl ? n : -1);
                    // counts[priority(node)]--;
                    cover[from] = -1;
                    pms[k*from+pl] = -1;
                    q.push(from);
                    todo_push(from);
                }
            }
        }
    }

    if (trace) {
        for (int n=0; n<nodecount(); n++) {
            logger << "\033[1;31mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            if (cover[n] >= 0) logger << " cover: " << cover[n];
            logger << std::endl;
        }
    }

    // Now set dominions and derive strategy for even.
    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        int *pm = pms + k*i;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(i, winner, owner(i) == winner ? strategy[i] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] cover;
    delete[] dirty;
    delete[] tmp;
    delete[] best;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}